

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

bool __thiscall QAccessibleTableCell::isValid(QAccessibleTableCell *this)

{
  Data *pDVar1;
  bool bVar2;
  undefined1 uVar3;
  QWidgetPrivate *pQVar4;
  QAbstractItemModel *pQVar5;
  QWidget *widget;
  
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this->view);
  if (bVar2) {
    pDVar1 = (this->view).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      widget = (QWidget *)0x0;
    }
    else {
      widget = (QWidget *)(this->view).wp.value;
    }
    pQVar4 = qt_widget_private(widget);
    if (((pQVar4->data).field_0x12 & 4) == 0) {
      pQVar5 = QAbstractItemView::model((QAbstractItemView *)(this->view).wp.value);
      if (pQVar5 != (QAbstractItemModel *)0x0) {
        uVar3 = QPersistentModelIndex::isValid();
        return (bool)uVar3;
      }
    }
  }
  return false;
}

Assistant:

bool QAccessibleTableCell::isValid() const
{
    return view && !qt_widget_private(view)->data.in_destructor
            && view->model() && m_index.isValid();
}